

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 __thiscall absl::operator>>(absl *this,uint128 lhs,int amount)

{
  byte bVar1;
  uint128 v;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t extraout_RDX;
  uint128 v_00;
  int amount_local;
  uint128 lhs_local;
  undefined8 local_10;
  
  v_00.lo_ = lhs.lo_;
  bVar1 = (byte)lhs.hi_;
  if ((int)lhs.hi_ < 0x40) {
    if ((int)lhs.hi_ == 0) {
      local_10 = v_00.lo_;
      lhs_local.hi_ = (uint64_t)this;
    }
    else {
      uVar2 = Uint128High64(this,lhs);
      v.hi_ = v_00.lo_;
      v.lo_ = (uint64_t)this;
      uVar3 = Uint128Low64(v);
      v_00.hi_ = extraout_RDX;
      uVar4 = Uint128High64(this,v_00);
      join_0x00000010_0x00000000_ =
           MakeUint128(uVar2 >> (bVar1 & 0x3f),
                       uVar3 >> (bVar1 & 0x3f) | uVar4 << (0x40 - bVar1 & 0x3f));
    }
  }
  else {
    uVar2 = Uint128High64(this,lhs);
    join_0x00000010_0x00000000_ = MakeUint128(0,uVar2 >> (bVar1 - 0x40 & 0x3f));
  }
  return stack0xffffffffffffffe8;
}

Assistant:

inline uint128 operator>>(uint128 lhs, int amount) {
  // uint64_t shifts of >= 64 are undefined, so we will need some
  // special-casing.
  if (amount < 64) {
    if (amount != 0) {
      return MakeUint128(Uint128High64(lhs) >> amount,
                         (Uint128Low64(lhs) >> amount) |
                             (Uint128High64(lhs) << (64 - amount)));
    }
    return lhs;
  }
  return MakeUint128(0, Uint128High64(lhs) >> (amount - 64));
}